

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O0

void __thiscall
duckdb::TextTreeRenderer::RenderBoxContent
          (TextTreeRenderer *this,RenderTree *root,ostream *ss,idx_t y)

{
  char *pcVar1;
  string *psVar2;
  bool bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  size_type sVar5;
  RenderTreeNode *pRVar6;
  reference pvVar7;
  ulong uVar8;
  string *in_RDX;
  long in_RSI;
  long in_RDI;
  iterator entry_2;
  iterator entry_1;
  iterator timing_entry;
  iterator entry;
  string render_text;
  bool has_child_to_the_right;
  optional_ptr<duckdb::RenderTreeNode,_true> node_1;
  idx_t i;
  bool has_adjacent_nodes;
  idx_t x_1;
  idx_t render_y;
  idx_t halfway_point;
  optional_ptr<duckdb::RenderTreeNode,_true> node;
  idx_t x;
  idx_t extra_height;
  vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
  extra_info;
  undefined7 in_stack_fffffffffffff7b8;
  undefined1 in_stack_fffffffffffff7bf;
  RenderTreeNode *in_stack_fffffffffffff7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7c8;
  string *in_stack_fffffffffffff7d0;
  iterator in_stack_fffffffffffff7d8;
  RenderTreeNode *in_stack_fffffffffffff7e0;
  iterator in_stack_fffffffffffff7e8;
  RenderTreeNode *in_stack_fffffffffffff800;
  undefined7 in_stack_fffffffffffff808;
  byte in_stack_fffffffffffff80f;
  undefined7 in_stack_fffffffffffff950;
  undefined1 in_stack_fffffffffffff957;
  string *in_stack_fffffffffffff958;
  char *in_stack_fffffffffffff9a0;
  string *in_stack_fffffffffffff9a8;
  bool local_5f9;
  string local_5b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  string local_570 [32];
  string local_550 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_530;
  allocator local_521;
  string local_520 [32];
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_500;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_4f8;
  allocator local_4e9;
  string local_4e8 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_4c8;
  string local_4c0 [32];
  string local_4a0 [8];
  idx_t in_stack_fffffffffffffb68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_fffffffffffffb70;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb78;
  TextTreeRenderer *in_stack_fffffffffffffb80;
  allocator local_471;
  string local_470 [32];
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_450;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_448;
  allocator local_439;
  string local_438 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_418;
  string local_410 [32];
  string local_3f0 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_3d0;
  allocator local_3c1;
  string local_3c0 [32];
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_3a0;
  string local_398 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_378;
  allocator local_369;
  string local_368 [32];
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_348;
  string local_340;
  allocator local_319;
  string local_318 [32];
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  string local_2b0 [39];
  allocator local_289;
  string local_288 [32];
  string local_268 [39];
  allocator local_241;
  string local_240 [32];
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  string local_1d8 [39];
  undefined1 local_1b1 [33];
  string local_190 [39];
  allocator local_169;
  string local_168 [32];
  string local_148 [39];
  allocator local_121;
  string local_120 [32];
  string local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [39];
  byte local_91;
  RenderTreeNode *local_90;
  long local_88;
  bool local_79;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  RenderTreeNode *local_60;
  ulong local_58;
  size_type local_40;
  string *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
  ::vector((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
            *)0x158668c);
  local_40 = 0;
  ::std::
  vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
  ::resize((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
            *)in_stack_fffffffffffff7e0,(size_type)in_stack_fffffffffffff7d8._M_current);
  for (local_58 = 0; local_58 < *(ulong *)(local_10 + 8); local_58 = local_58 + 1) {
    local_60 = (RenderTreeNode *)
               RenderTree::GetNode((RenderTree *)in_stack_fffffffffffff7c8,
                                   (idx_t)in_stack_fffffffffffff7c0,
                                   CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
    bVar3 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_60);
    if (bVar3) {
      optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffff7c0);
      vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
      ::operator[]((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                    *)in_stack_fffffffffffff7c0,
                   CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
      SplitUpExtraInfo(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70
                       ,in_stack_fffffffffffffb68);
      pvVar4 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                  ::operator[]((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                                *)in_stack_fffffffffffff7c0,
                               CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
      sVar5 = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar4);
      if (local_40 < sVar5) {
        pvVar4 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                    ::operator[]((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                                  *)in_stack_fffffffffffff7c0,
                                 CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
        local_40 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(pvVar4);
      }
    }
  }
  local_68 = local_40 + 1 >> 1;
  local_70 = 0;
  do {
    if (local_40 < local_70) {
      vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
      ::~vector((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                 *)0x15882ee);
      return;
    }
    for (local_78 = 0;
        (local_78 < *(ulong *)(local_10 + 8) &&
        (local_78 * *(long *)(in_RDI + 0x10) < *(ulong *)(in_RDI + 8))); local_78 = local_78 + 1) {
      local_79 = false;
      for (local_88 = 0; local_78 + local_88 < *(ulong *)(local_10 + 8); local_88 = local_88 + 1) {
        local_5f9 = true;
        if (local_79 == false) {
          local_5f9 = RenderTree::HasNode((RenderTree *)in_stack_fffffffffffff7c8,
                                          (idx_t)in_stack_fffffffffffff7c0,
                                          CONCAT17(in_stack_fffffffffffff7bf,
                                                   in_stack_fffffffffffff7b8));
        }
        local_79 = local_5f9;
      }
      local_90 = (RenderTreeNode *)
                 RenderTree::GetNode((RenderTree *)in_stack_fffffffffffff7c8,
                                     (idx_t)in_stack_fffffffffffff7c0,
                                     CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
      bVar3 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_90);
      psVar2 = local_18;
      if (bVar3) {
        ::std::operator<<((ostream *)local_18,*(char **)(in_RDI + 0x78));
        ::std::__cxx11::string::string((string *)&local_340);
        uVar8 = local_70;
        if (local_70 == 0) {
          pRVar6 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                             ((optional_ptr<duckdb::RenderTreeNode,_true> *)
                              in_stack_fffffffffffff7c0);
          ::std::__cxx11::string::operator=((string *)&local_340,(string *)pRVar6);
        }
        else {
          pvVar4 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                      ::operator[]((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                                    *)in_stack_fffffffffffff7c0,
                                   CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
          sVar5 = ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(pvVar4);
          if (uVar8 <= sVar5) {
            vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
            ::operator[]((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                          *)in_stack_fffffffffffff7c0,
                         CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
            pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                   *)in_stack_fffffffffffff7c0,
                                  CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
            ::std::__cxx11::string::operator=((string *)&local_340,(string *)pvVar7);
          }
        }
        if ((local_70 + 1 == local_40) &&
           (uVar8 = ::std::__cxx11::string::empty(), (uVar8 & 1) != 0)) {
          optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                    ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffff7c0);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_368,"__cardinality__",&local_369);
          local_348._M_current =
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::find(in_stack_fffffffffffff7d8._M_current,in_stack_fffffffffffff7d0);
          ::std::__cxx11::string::~string(local_368);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_369);
          optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                    ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffff7c0);
          local_378 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::end((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)in_stack_fffffffffffff7c0,
                             (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
          if (bVar3) {
            __gnu_cxx::
            __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator->(&local_348);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff7e8._M_current,(char *)in_stack_fffffffffffff7e0)
            ;
            ::std::__cxx11::string::operator=((string *)&local_340,local_398);
            ::std::__cxx11::string::~string(local_398);
          }
        }
        if ((local_70 == local_40) && (uVar8 = ::std::__cxx11::string::empty(), (uVar8 & 1) != 0)) {
          optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                    ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffff7c0);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_3c0,"__timing__",&local_3c1);
          local_3a0._M_current =
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::find(in_stack_fffffffffffff7d8._M_current,in_stack_fffffffffffff7d0);
          ::std::__cxx11::string::~string(local_3c0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
          optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                    ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffff7c0);
          local_3d0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::end((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)in_stack_fffffffffffff7c0,
                             (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
          if (bVar3) {
            __gnu_cxx::
            __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator->(&local_3a0);
            ::std::operator+((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff800);
            ::std::operator+(in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0);
            ::std::__cxx11::string::operator=((string *)&local_340,local_3f0);
            ::std::__cxx11::string::~string(local_3f0);
            ::std::__cxx11::string::~string(local_410);
          }
          else {
            optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                      ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffff7c0);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_438,"__cardinality__",&local_439);
            local_418 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::find(in_stack_fffffffffffff7d8._M_current,in_stack_fffffffffffff7d0);
            optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                      ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffff7c0);
            local_448 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::end((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
            bVar3 = __gnu_cxx::operator==
                              ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)in_stack_fffffffffffff7c0,
                               (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
            ::std::__cxx11::string::~string(local_438);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_439);
            if (bVar3) {
              optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                        ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffff7c0);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string(local_470,"__estimated_cardinality__",&local_471);
              local_450._M_current =
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::find(in_stack_fffffffffffff7d8._M_current,in_stack_fffffffffffff7d0);
              ::std::__cxx11::string::~string(local_470);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_471);
              optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                        ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffff7c0);
              InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::end((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
              bVar3 = __gnu_cxx::operator!=
                                ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  *)in_stack_fffffffffffff7c0,
                                 (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
              if (bVar3) {
                __gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator->(&local_450);
                ::std::operator+((char *)CONCAT17(in_stack_fffffffffffff80f,
                                                  in_stack_fffffffffffff808),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff800);
                ::std::operator+(in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0);
                ::std::__cxx11::string::operator=((string *)&local_340,local_4a0);
                ::std::__cxx11::string::~string(local_4a0);
                ::std::__cxx11::string::~string(local_4c0);
              }
            }
          }
          optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                    ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffff7c0);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_4e8,"__cardinality__",&local_4e9);
          local_4c8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::find(in_stack_fffffffffffff7d8._M_current,in_stack_fffffffffffff7d0);
          optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                    ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffff7c0);
          local_4f8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::end((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
          in_stack_fffffffffffff80f =
               __gnu_cxx::operator==
                         ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)in_stack_fffffffffffff7c0,
                          (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
          ::std::__cxx11::string::~string(local_4e8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
          if ((in_stack_fffffffffffff80f & 1) != 0) {
            in_stack_fffffffffffff800 =
                 optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                           ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffff7c0)
            ;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_520,"__estimated_cardinality__",&local_521);
            in_stack_fffffffffffff7e8 =
                 InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::find(in_stack_fffffffffffff7d8._M_current,in_stack_fffffffffffff7d0);
            local_500._M_current = in_stack_fffffffffffff7e8._M_current;
            ::std::__cxx11::string::~string(local_520);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_521);
            in_stack_fffffffffffff7e0 =
                 optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                           ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffff7c0)
            ;
            in_stack_fffffffffffff7d8 =
                 InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::end((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
            local_530 = in_stack_fffffffffffff7d8._M_current;
            bVar3 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)in_stack_fffffffffffff7c0,
                               (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
            if (bVar3) {
              __gnu_cxx::
              __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator->(&local_500);
              ::std::operator+((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808)
                               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff800);
              ::std::operator+(in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0);
              ::std::__cxx11::string::operator=((string *)&local_340,local_550);
              ::std::__cxx11::string::~string(local_550);
              ::std::__cxx11::string::~string(local_570);
            }
          }
        }
        ::std::__cxx11::string::string(local_5b0,(string *)&local_340);
        AdjustTextForRendering(in_stack_fffffffffffff9a8,(idx_t)in_stack_fffffffffffff9a0);
        in_stack_fffffffffffff7d0 = &local_340;
        in_stack_fffffffffffff7c8 = &local_590;
        ::std::__cxx11::string::operator=
                  ((string *)in_stack_fffffffffffff7d0,(string *)in_stack_fffffffffffff7c8);
        ::std::__cxx11::string::~string((string *)in_stack_fffffffffffff7c8);
        ::std::__cxx11::string::~string(local_5b0);
        ::std::operator<<((ostream *)local_18,(string *)in_stack_fffffffffffff7d0);
        if (local_70 == local_68) {
          in_stack_fffffffffffff7c0 =
               optional_ptr<duckdb::RenderTreeNode,_true>::operator*
                         ((optional_ptr<duckdb::RenderTreeNode,_true> *)in_stack_fffffffffffff7c0);
          in_stack_fffffffffffff7bf = NodeHasMultipleChildren((RenderTreeNode *)0x158820c);
          if (!(bool)in_stack_fffffffffffff7bf) goto LAB_0158825c;
          ::std::operator<<((ostream *)local_18,*(char **)(in_RDI + 0x60));
        }
        else {
LAB_0158825c:
          ::std::operator<<((ostream *)local_18,*(char **)(in_RDI + 0x78));
        }
        ::std::__cxx11::string::~string((string *)&local_340);
      }
      else if (local_70 == local_68) {
        local_91 = ShouldRenderWhitespace
                             ((RenderTree *)in_stack_fffffffffffff7d8._M_current,
                              (idx_t)in_stack_fffffffffffff7d0,(idx_t)in_stack_fffffffffffff7c8);
        bVar3 = RenderTree::HasNode((RenderTree *)in_stack_fffffffffffff7c8,
                                    (idx_t)in_stack_fffffffffffff7c0,
                                    CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
        psVar2 = local_18;
        if (bVar3) {
          pcVar1 = *(char **)(in_RDI + 0x80);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_d8,pcVar1,&local_d9);
          StringUtil::Repeat(in_stack_fffffffffffff958,
                             CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
          ::std::operator<<((ostream *)psVar2,local_b8);
          ::std::__cxx11::string::~string(local_b8);
          ::std::__cxx11::string::~string(local_d8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_d9);
          if ((local_91 & 1) == 0) {
            ::std::operator<<((ostream *)local_18,*(char **)(in_RDI + 0x38));
            psVar2 = local_18;
            if ((local_79 & 1U) != 0) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string(local_168," ",&local_169);
              StringUtil::Repeat(in_stack_fffffffffffff958,
                                 CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
              ::std::operator<<((ostream *)psVar2,local_148);
              ::std::__cxx11::string::~string(local_148);
              ::std::__cxx11::string::~string(local_168);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_169);
            }
          }
          else {
            ::std::operator<<((ostream *)local_18,*(char **)(in_RDI + 0x58));
            psVar2 = local_18;
            pcVar1 = *(char **)(in_RDI + 0x80);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_120,pcVar1,&local_121);
            StringUtil::Repeat(in_stack_fffffffffffff958,
                               CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
            ::std::operator<<((ostream *)psVar2,local_100);
            ::std::__cxx11::string::~string(local_100);
            ::std::__cxx11::string::~string(local_120);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_121);
          }
        }
        else if ((local_91 & 1) == 0) {
          if ((local_79 & 1U) != 0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_1f8," ",&local_1f9);
            StringUtil::Repeat(in_stack_fffffffffffff958,
                               CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
            ::std::operator<<((ostream *)psVar2,local_1d8);
            ::std::__cxx11::string::~string(local_1d8);
            ::std::__cxx11::string::~string(local_1f8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
          }
        }
        else {
          in_stack_fffffffffffff9a0 = *(char **)(in_RDI + 0x80);
          in_stack_fffffffffffff9a8 = (string *)local_1b1;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)(local_1b1 + 1),in_stack_fffffffffffff9a0,
                     (allocator *)in_stack_fffffffffffff9a8);
          StringUtil::Repeat(in_stack_fffffffffffff958,
                             CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
          ::std::operator<<((ostream *)psVar2,local_190);
          ::std::__cxx11::string::~string(local_190);
          ::std::__cxx11::string::~string((string *)(local_1b1 + 1));
          ::std::allocator<char>::~allocator((allocator<char> *)local_1b1);
        }
      }
      else if (local_70 < local_68) {
        if ((local_79 & 1U) != 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_318," ",&local_319);
          StringUtil::Repeat(in_stack_fffffffffffff958,
                             CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
          ::std::operator<<((ostream *)psVar2,local_2f8);
          ::std::__cxx11::string::~string(local_2f8);
          ::std::__cxx11::string::~string(local_318);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_319);
        }
      }
      else {
        bVar3 = RenderTree::HasNode((RenderTree *)in_stack_fffffffffffff7c8,
                                    (idx_t)in_stack_fffffffffffff7c0,
                                    CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
        psVar2 = local_18;
        if (bVar3) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_240," ",&local_241);
          StringUtil::Repeat(in_stack_fffffffffffff958,
                             CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
          ::std::operator<<((ostream *)psVar2,local_220);
          ::std::__cxx11::string::~string(local_220);
          ::std::__cxx11::string::~string(local_240);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_241);
          ::std::operator<<((ostream *)local_18,*(char **)(in_RDI + 0x78));
          if (((local_79 & 1U) != 0) ||
             (bVar3 = ShouldRenderWhitespace
                                ((RenderTree *)in_stack_fffffffffffff7d8._M_current,
                                 (idx_t)in_stack_fffffffffffff7d0,(idx_t)in_stack_fffffffffffff7c8),
             bVar3)) {
            in_stack_fffffffffffff958 = local_18;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_288," ",&local_289);
            StringUtil::Repeat(in_stack_fffffffffffff958,
                               CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
            ::std::operator<<((ostream *)in_stack_fffffffffffff958,local_268);
            ::std::__cxx11::string::~string(local_268);
            ::std::__cxx11::string::~string(local_288);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_289);
          }
        }
        else if (((local_79 & 1U) != 0) ||
                (in_stack_fffffffffffff957 =
                      ShouldRenderWhitespace
                                ((RenderTree *)in_stack_fffffffffffff7d8._M_current,
                                 (idx_t)in_stack_fffffffffffff7d0,(idx_t)in_stack_fffffffffffff7c8),
                (bool)in_stack_fffffffffffff957)) {
          psVar2 = local_18;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_2d0," ",&local_2d1);
          StringUtil::Repeat(in_stack_fffffffffffff958,
                             CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
          ::std::operator<<((ostream *)psVar2,local_2b0);
          ::std::__cxx11::string::~string(local_2b0);
          ::std::__cxx11::string::~string(local_2d0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
        }
      }
    }
    ::std::operator<<((ostream *)local_18,'\n');
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

void TextTreeRenderer::RenderBoxContent(RenderTree &root, std::ostream &ss, idx_t y) {
	// we first need to figure out how high our boxes are going to be
	vector<vector<string>> extra_info;
	idx_t extra_height = 0;
	extra_info.resize(root.width);
	for (idx_t x = 0; x < root.width; x++) {
		auto node = root.GetNode(x, y);
		if (node) {
			SplitUpExtraInfo(node->extra_text, extra_info[x], config.max_extra_lines);
			if (extra_info[x].size() > extra_height) {
				extra_height = extra_info[x].size();
			}
		}
	}
	idx_t halfway_point = (extra_height + 1) / 2;
	// now we render the actual node
	for (idx_t render_y = 0; render_y <= extra_height; render_y++) {
		for (idx_t x = 0; x < root.width; x++) {
			if (x * config.node_render_width >= config.maximum_render_width) {
				break;
			}
			bool has_adjacent_nodes = false;
			for (idx_t i = 0; x + i < root.width; i++) {
				has_adjacent_nodes = has_adjacent_nodes || root.HasNode(x + i, y);
			}
			auto node = root.GetNode(x, y);
			if (!node) {
				if (render_y == halfway_point) {
					bool has_child_to_the_right = ShouldRenderWhitespace(root, x, y);
					if (root.HasNode(x, y + 1)) {
						// node right below this one
						ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2);
						if (has_child_to_the_right) {
							ss << config.TMIDDLE;
							// but we have another child to the right! keep rendering the line
							ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2);
						} else {
							ss << config.RTCORNER;
							if (has_adjacent_nodes) {
								// only a child below this one: fill the rest with spaces
								ss << StringUtil::Repeat(" ", config.node_render_width / 2);
							}
						}
					} else if (has_child_to_the_right) {
						// child to the right, but no child right below this one: render a full line
						ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width);
					} else {
						if (has_adjacent_nodes) {
							// empty spot: render spaces
							ss << StringUtil::Repeat(" ", config.node_render_width);
						}
					}
				} else if (render_y >= halfway_point) {
					if (root.HasNode(x, y + 1)) {
						// we have a node below this empty spot: render a vertical line
						ss << StringUtil::Repeat(" ", config.node_render_width / 2);
						ss << config.VERTICAL;
						if (has_adjacent_nodes || ShouldRenderWhitespace(root, x, y)) {
							ss << StringUtil::Repeat(" ", config.node_render_width / 2);
						}
					} else {
						if (has_adjacent_nodes || ShouldRenderWhitespace(root, x, y)) {
							// empty spot: render spaces
							ss << StringUtil::Repeat(" ", config.node_render_width);
						}
					}
				} else {
					if (has_adjacent_nodes) {
						// empty spot: render spaces
						ss << StringUtil::Repeat(" ", config.node_render_width);
					}
				}
			} else {
				ss << config.VERTICAL;
				// figure out what to render
				string render_text;
				if (render_y == 0) {
					render_text = node->name;
				} else {
					if (render_y <= extra_info[x].size()) {
						render_text = extra_info[x][render_y - 1];
					}
				}
				if (render_y + 1 == extra_height && render_text.empty()) {
					auto entry = node->extra_text.find(RenderTreeNode::CARDINALITY);
					if (entry != node->extra_text.end()) {
						render_text = entry->second + " Rows";
					}
				}
				if (render_y == extra_height && render_text.empty()) {
					auto timing_entry = node->extra_text.find(RenderTreeNode::TIMING);
					if (timing_entry != node->extra_text.end()) {
						render_text = "(" + timing_entry->second + ")";
					} else if (node->extra_text.find(RenderTreeNode::CARDINALITY) == node->extra_text.end()) {
						// we only render estimated cardinality if there is no real cardinality
						auto entry = node->extra_text.find(RenderTreeNode::ESTIMATED_CARDINALITY);
						if (entry != node->extra_text.end()) {
							render_text = "~" + entry->second + " Rows";
						}
					}
					if (node->extra_text.find(RenderTreeNode::CARDINALITY) == node->extra_text.end()) {
						// we only render estimated cardinality if there is no real cardinality
						auto entry = node->extra_text.find(RenderTreeNode::ESTIMATED_CARDINALITY);
						if (entry != node->extra_text.end()) {
							render_text = "~" + entry->second + " Rows";
						}
					}
				}
				render_text = AdjustTextForRendering(render_text, config.node_render_width - 2);
				ss << render_text;

				if (render_y == halfway_point && NodeHasMultipleChildren(*node)) {
					ss << config.LMIDDLE;
				} else {
					ss << config.VERTICAL;
				}
			}
		}
		ss << '\n';
	}
}